

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint32_t hydro_random_uniform(uint32_t upper_bound)

{
  uint32_t uVar1;
  uint in_EDI;
  uint32_t r;
  uint32_t min;
  undefined4 local_4;
  
  if (in_EDI < 2) {
    local_4 = 0;
  }
  else {
    do {
      uVar1 = hydro_random_u32();
    } while (uVar1 < ((in_EDI ^ 0xffffffff) + 1) % in_EDI);
    local_4 = uVar1 % in_EDI;
  }
  return local_4;
}

Assistant:

uint32_t
hydro_random_uniform(const uint32_t upper_bound)
{
    uint32_t min;
    uint32_t r;

    if (upper_bound < 2U) {
        return 0;
    }
    min = (1U + ~upper_bound) % upper_bound; /* = 2**32 mod upper_bound */
    do {
        r = hydro_random_u32();
    } while (r < min);
    /* r is now clamped to a set whose size mod upper_bound == 0
     * the worst case (2**31+1) requires 2 attempts on average */

    return r % upper_bound;
}